

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitContinueStatement(SyntaxDumper *this,ContinueStatementSyntax *node)

{
  ContinueStatementSyntax local_50 [56];
  
  ContinueStatementSyntax::continueKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  ContinueStatementSyntax::semicolonToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitContinueStatement(const ContinueStatementSyntax* node) override
    {
        terminal(node->continueKeyword(), node);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }